

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::snedecor_f_dist<double>::pdf(snedecor_f_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = (double)(this->P).n_;
  dVar8 = (double)(this->P).m_;
  dVar2 = log(dVar1 / dVar8);
  dVar3 = log(x);
  dVar9 = dVar1 * 0.5;
  dVar4 = log((x * dVar1) / dVar8 + 1.0);
  dVar5 = lgamma(dVar9);
  dVar6 = lgamma(dVar8 * 0.5);
  dVar7 = lgamma((dVar8 + dVar1) * 0.5);
  dVar1 = exp(dVar7 + ((((dVar3 * (dVar9 + -1.0) + dVar2 * 0.5 * dVar1) -
                        (dVar9 + dVar8 * 0.5) * dVar4) - dVar5) - dVar6));
  return dVar1;
}

Assistant:

pdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      // return math::exp(math::ln(n)*result_type(1)/result_type(2)*n +
      // math::ln(m)*result_type(1)/result_type(2)*m -
      // 		       math::ln(m+n*x)*result_type(1)/result_type(2)*(m+n) +
      // 		       math::ln(x)*(result_type(1)/result_type(2)*n-1))/math::Beta(result_type(1)/result_type(2)*n,
      // result_type(1)/result_type(2)*m);
      return math::exp(result_type(1) / result_type(2) * math::ln(n / m) * n +
                       math::ln(x) * (result_type(1) / result_type(2) * n - 1) -
                       math::ln(1 + n * x / m) * (result_type(1) / result_type(2) * n +
                                                  result_type(1) / result_type(2) * m) -
                       math::ln_Gamma(result_type(1) / result_type(2) * n) -
                       math::ln_Gamma(result_type(1) / result_type(2) * m) +
                       math::ln_Gamma(result_type(1) / result_type(2) * (n + m)));
    }